

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O0

double inform_shannon_multi_pmi
                 (inform_dist *joint,inform_dist **marginals,size_t n,size_t joint_event,
                 size_t *marginal_events,double base)

{
  double dVar1;
  ulong local_50;
  size_t i;
  double pmi;
  double base_local;
  size_t *marginal_events_local;
  size_t joint_event_local;
  size_t n_local;
  inform_dist **marginals_local;
  inform_dist *joint_local;
  
  if (n < 2) {
    joint_local = (inform_dist *)0x0;
  }
  else {
    dVar1 = inform_shannon_si(joint,joint_event,base);
    i = (size_t)-dVar1;
    for (local_50 = 0; local_50 < n; local_50 = local_50 + 1) {
      dVar1 = inform_shannon_si(marginals[local_50],marginal_events[local_50],base);
      i = (size_t)(dVar1 + (double)i);
    }
    joint_local = (inform_dist *)i;
  }
  return (double)joint_local;
}

Assistant:

double inform_shannon_multi_pmi(inform_dist const *joint,
    inform_dist const **marginals, size_t n, size_t joint_event,
    size_t const *marginal_events, double base)
{
    if (n < 2)
    {
        return 0.0;
    }
    double pmi = -inform_shannon_si(joint, joint_event, base);
    for (size_t i = 0; i < n; ++i)
    {
        pmi += inform_shannon_si(marginals[i], marginal_events[i], base);
    }
    return pmi;
}